

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O2

void duckdb::FirstFunction<false,false>::
     Operation<signed_char,duckdb::FirstState<signed_char>,duckdb::FirstFunction<false,false>>
               (FirstState<signed_char> *state,char *input,AggregateUnaryInput *unary_input)

{
  bool bVar1;
  
  if (state->is_set == false) {
    bVar1 = AggregateUnaryInput::RowIsValid(unary_input);
    state->is_set = true;
    if (bVar1) {
      state->is_null = false;
      state->value = *input;
    }
    else {
      state->is_null = true;
    }
  }
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		if (LAST || !state.is_set) {
			if (!unary_input.RowIsValid()) {
				if (!SKIP_NULLS) {
					state.is_set = true;
				}
				state.is_null = true;
			} else {
				state.is_set = true;
				state.is_null = false;
				state.value = input;
			}
		}
	}